

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayoutPrivate::getItemPosition
          (QGridLayoutPrivate *this,int index,int *row,int *column,int *rowSpan,int *columnSpan)

{
  QGridBox *this_00;
  int iVar1;
  int iVar2;
  QList<QGridBox_*> *this_01;
  qsizetype qVar3;
  const_reference ppQVar4;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int toCol;
  int toRow;
  QGridBox *b;
  qsizetype in_stack_ffffffffffffffa8;
  
  if (-1 < in_ESI) {
    this_01 = (QList<QGridBox_*> *)(long)in_ESI;
    qVar3 = QList<QGridBox_*>::size((QList<QGridBox_*> *)(in_RDI + 0x150));
    if ((long)this_01 < qVar3) {
      ppQVar4 = QList<QGridBox_*>::at(this_01,in_stack_ffffffffffffffa8);
      this_00 = *ppQVar4;
      iVar1 = QGridBox::toRow(this_00,*(int *)(in_RDI + 0xb0));
      iVar2 = QGridBox::toCol(this_00,*(int *)(in_RDI + 0xb4));
      *in_RDX = this_00->row;
      *in_RCX = this_00->col;
      *in_R8 = (iVar1 - *in_RDX) + 1;
      *in_R9 = (iVar2 - *in_RCX) + 1;
    }
  }
  return;
}

Assistant:

void getItemPosition(int index, int *row, int *column, int *rowSpan, int *columnSpan) const {
        if (index >= 0 && index < things.size()) {
            const QGridBox *b =  things.at(index);
            int toRow = b->toRow(rr);
            int toCol = b->toCol(cc);
            *row = b->row;
            *column = b->col;
            *rowSpan = toRow - *row + 1;
            *columnSpan = toCol - *column +1;
        }
    }